

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlStringLenDecodeEntities(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_60;
  byte local_53;
  undefined1 local_52;
  undefined1 local_51;
  undefined4 local_50;
  xmlChar end3;
  xmlChar end2;
  undefined4 uStack_4c;
  xmlChar end;
  int what;
  int len;
  xmlChar *str;
  PyObject *pyobj_ctxt;
  xmlParserCtxtPtr ctxt;
  xmlChar *c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("xmlStringLenDecodeEntities");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT
                      (py_retval,"Oziiccc:xmlStringLenDecodeEntities",&str,&what,
                       &stack0xffffffffffffffb4,&local_50,&local_51,&local_52,&local_53);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      if (str == &_Py_NoneStruct) {
        local_60 = (PyObject *)0x0;
      }
      else {
        local_60 = *(PyObject **)(str + 0x10);
      }
      pyobj_ctxt = local_60;
      ctxt = (xmlParserCtxtPtr)
             xmlStringLenDecodeEntities
                       (local_60,_what,uStack_4c,local_50,local_51,local_52,local_53);
      self_local = libxml_xmlCharPtrWrap((xmlChar *)ctxt);
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlStringLenDecodeEntities(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlChar * c_retval;
    xmlParserCtxtPtr ctxt;
    PyObject *pyobj_ctxt;
    xmlChar * str;
    int len;
    int what;
    xmlChar end;
    xmlChar end2;
    xmlChar end3;

    if (libxml_deprecationWarning("xmlStringLenDecodeEntities") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"Oziiccc:xmlStringLenDecodeEntities", &pyobj_ctxt, &str, &len, &what, &end, &end2, &end3))
        return(NULL);
    ctxt = (xmlParserCtxtPtr) PyparserCtxt_Get(pyobj_ctxt);

    c_retval = xmlStringLenDecodeEntities(ctxt, str, len, what, end, end2, end3);
    py_retval = libxml_xmlCharPtrWrap((xmlChar *) c_retval);
    return(py_retval);
}